

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

bool __thiscall Board::canMove(Board *this,Block block,int direction)

{
  int row_00;
  int column_00;
  int iVar1;
  bool bVar2;
  int length;
  int column;
  int row;
  bool canMoveThere;
  int direction_local;
  Board *this_local;
  
  row_00 = block.row;
  column_00 = block.column;
  iVar1 = block.length;
  column._3_1_ = false;
  bVar2 = Block::isHorizontal(&block);
  if (bVar2) {
    if (direction == 0) {
      column._3_1_ = isMovable(this,row_00,column_00 + -1);
    }
    else if (direction == 1) {
      column._3_1_ = isMovable(this,row_00,column_00 + iVar1);
    }
  }
  else if (direction == 2) {
    column._3_1_ = isMovable(this,row_00 - iVar1,column_00);
  }
  else if (direction == 3) {
    column._3_1_ = isMovable(this,row_00 + 1,column_00);
  }
  return column._3_1_;
}

Assistant:

bool Board::canMove(Block block, int direction) {
    bool canMoveThere = false;
    int row = block.row;
    int column = block.column;
    int length = block.length;

    // Check the vertical and horizontal blocks separately.
    if (block.isHorizontal()) {
        switch (direction) {
            case LEFT:
                if (isMovable(row, column - 1)) {
                    canMoveThere = true;
                }
                break;
            case RIGHT:
                if (isMovable(row, column + length)) {
                    canMoveThere = true;
                }
                break;
            default:
                break;
        }
    } else {
        switch (direction) {
            case UP:
                if (isMovable(row - length, column)) {
                    canMoveThere = true;
                }
                break;
            case DOWN:
                if (isMovable(row + 1, column)) {
                    canMoveThere = true;
                }
                break;
            default:
                break;
        }
    }
    return canMoveThere;
}